

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

void __thiscall clunk::Node::OutputPV(Node *this,int score,int bound)

{
  int iVar1;
  Output *this_00;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  Move *this_01;
  Output out;
  string local_50;
  
  if (0 < this->pvCount) {
    senjo::Now();
    senjo::Output::Output(&out,NoPrefix);
    std::operator<<((ostream *)&std::cout,"info depth ");
    this_00 = senjo::Output::operator<<(&out,&_depth);
    std::operator<<((ostream *)&std::cout," seldepth ");
    senjo::Output::operator<<(this_00,&_seldepth);
    std::operator<<((ostream *)&std::cout," nodes ");
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<((ostream *)&std::cout," time ");
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<((ostream *)&std::cout," nps ");
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    if (bound != 0) {
      std::operator<<((ostream *)&std::cout," currmovenumber ");
      senjo::Output::operator<<(&out,&_movenum);
      std::operator<<((ostream *)&std::cout," currmove ");
      std::operator<<((ostream *)&std::cout,(string *)&_currmove_abi_cxx11_);
    }
    uVar2 = -score;
    if (0 < score) {
      uVar2 = score;
    }
    if (uVar2 < 31000) {
      std::operator<<((ostream *)&std::cout," score cp ");
      std::ostream::operator<<((ostream *)&std::cout,score);
    }
    else {
      std::operator<<((ostream *)&std::cout," score mate ");
      iVar1 = (int)(0x7d01 - uVar2) / 2;
      iVar3 = -iVar1;
      if (-1 < score) {
        iVar3 = iVar1;
      }
      std::ostream::operator<<((ostream *)&std::cout,iVar3);
    }
    if (bound == 0) {
      std::operator<<((ostream *)&std::cout," pv");
      this_01 = this->pv;
      for (lVar5 = 0; lVar5 < this->pvCount; lVar5 = lVar5 + 1) {
        std::operator<<((ostream *)&std::cout,' ');
        Move::ToString_abi_cxx11_(&local_50,this_01);
        std::operator<<((ostream *)&std::cout,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        this_01 = this_01 + 1;
      }
    }
    else {
      pcVar4 = " lowerbound";
      if (bound < 0) {
        pcVar4 = " upperbound";
      }
      std::operator<<((ostream *)&std::cout,pcVar4);
    }
    senjo::Output::~Output(&out);
  }
  return;
}

Assistant:

void OutputPV(const int score, const int bound = 0) const {
    if (pvCount > 0) {
      const uint64_t msecs = (senjo::Now() - _startTime);
      senjo::Output out(senjo::Output::NoPrefix);

      const uint64_t nodes = (_stats.snodes + _stats.qnodes);
      out << "info depth " << _depth
          << " seldepth " << _seldepth
          << " nodes " << nodes
          << " time " << msecs
          << " nps " << static_cast<uint64_t>(senjo::Rate(nodes, msecs));

      if (bound) {
        out << " currmovenumber " << _movenum
            << " currmove " << _currmove;
      }

      if (abs(score) < MateScore) {
        out << " score cp " << score;
      }
      else {
        const int count = (Infinity - abs(score));
        const int mate = ((count + 1) / 2);
        out << " score mate " << ((score < 0) ? -mate : mate);
      }

      if (bound) {
        out << ((bound < 0) ? " upperbound" : " lowerbound");
      }
      else {
        out << " pv";
        for (int i = 0; i < pvCount; ++i) {
          const Move& move = pv[i];
          out << ' ' << move.ToString();
        }
      }
    }
  }